

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTiming.c
# Opt level: O0

void draw(IceTDouble *projection_matrix,IceTDouble *modelview_matrix,IceTFloat *background_color,
         IceTInt *readback_viewport,IceTImage result)

{
  double dVar1;
  float *pfVar2;
  undefined1 *puVar3;
  long lVar4;
  IceTInt *pIVar5;
  undefined8 *puVar6;
  byte bVar7;
  double dVar8;
  hexahedron in_stack_fffffffffffffc38;
  int local_304;
  IceTFloat *depth_dest;
  IceTUByte *color_dest_1;
  IceTFloat *color_dest;
  IceTDouble opacity;
  IceTDouble thickness;
  IceTDouble shading;
  IceTDouble *near_plane;
  float local_2a8;
  IceTFloat depth;
  IceTFloat color [4];
  IceTBoolean local_28d;
  int local_28c;
  IceTBoolean intersection_happened;
  double dStack_288;
  IceTInt near_plane_index;
  IceTDouble far_distance;
  IceTDouble near_distance;
  IceTDouble *transformed_plane;
  IceTDouble *original_plane;
  IceTDouble ray_direction [3];
  double local_248;
  IceTDouble ray_origin [3];
  int local_228;
  int local_224;
  IceTInt pixel_y;
  IceTInt pixel_x;
  IceTFloat *depths;
  IceTUByte *colors_byte;
  IceTFloat *colors_float;
  IceTInt screen_height;
  IceTInt screen_width;
  hexahedron transformed_box;
  int planeIdx;
  IceTBoolean success;
  IceTDouble inverse_transpose_transform [16];
  IceTDouble transform [16];
  IceTInt *readback_viewport_local;
  IceTFloat *background_color_local;
  IceTDouble *modelview_matrix_local;
  IceTDouble *projection_matrix_local;
  IceTImage result_local;
  
  bVar7 = 0;
  colors_byte = (IceTUByte *)0x0;
  depths = (IceTFloat *)0x0;
  _pixel_y = (IceTFloat *)0x0;
  icetMatrixMultiply(inverse_transpose_transform + 0xf,projection_matrix,modelview_matrix);
  transformed_box.planes[5][3]._7_1_ =
       icetMatrixInverseTranspose(inverse_transpose_transform + 0xf,(IceTDouble *)&planeIdx);
  if (transformed_box.planes[5][3]._7_1_ == '\0') {
    printf("ERROR: Inverse failed.\n");
  }
  for (transformed_box.planes[5][3]._0_4_ = 0; transformed_box.planes[5][3]._0_4_ < 6;
      transformed_box.planes[5][3]._0_4_ = transformed_box.planes[5][3]._0_4_ + 1) {
    transformed_plane = unit_box.planes[transformed_box.planes[5][3]._0_4_];
    near_distance = (IceTDouble)(&screen_height + (long)transformed_box.planes[5][3]._0_4_ * 8);
    icetMatrixVectorMultiply((IceTDouble *)near_distance,(IceTDouble *)&planeIdx,transformed_plane);
  }
  icetGetIntegerv(7,(IceTInt *)((long)&colors_float + 4));
  icetGetIntegerv(8,(IceTInt *)&colors_float);
  if (g_transparent == '\0') {
    depths = (IceTFloat *)icetImageGetColorub(result);
    _pixel_y = icetImageGetDepthf(result);
  }
  else {
    colors_byte = (IceTUByte *)icetImageGetColorf(result);
  }
  ray_direction[0] = 0.0;
  original_plane = (IceTDouble *)0x0;
  ray_direction[1] = 1.0;
  ray_origin[1] = -1.0;
  for (local_228 = readback_viewport[1]; local_228 < readback_viewport[1] + readback_viewport[3];
      local_228 = local_228 + 1) {
    ray_origin[0] = (IceTDouble)(((double)local_228 * 2.0) / (double)(int)colors_float - 1.0);
    for (local_224 = *readback_viewport; local_224 < *readback_viewport + readback_viewport[2];
        local_224 = local_224 + 1) {
      local_248 = ((double)local_224 * 2.0) / (double)colors_float._4_4_ - 1.0;
      pIVar5 = &screen_height;
      puVar6 = (undefined8 *)&stack0xfffffffffffffc38;
      for (lVar4 = 0x18; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar6 = *(undefined8 *)pIVar5;
        pIVar5 = pIVar5 + (ulong)bVar7 * -4 + 2;
        puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
      }
      intersect_ray_hexahedron
                ((IceTDouble *)&local_248,(IceTDouble *)&original_plane,in_stack_fffffffffffffc38,
                 &far_distance,(IceTDouble *)&stack0xfffffffffffffd78,&local_28c,&local_28d);
      if (local_28d == '\0') {
        local_2a8 = (float)*background_color;
        depth = background_color[1];
        color[0] = background_color[2];
        color[1] = background_color[3];
        near_plane._4_4_ = 1.0;
      }
      else {
        lVar4 = (long)local_28c;
        dVar1 = (double)transformed_box.planes[lVar4][1];
        dVar8 = sqrt((double)transformed_box.planes[lVar4][1] *
                     (double)transformed_box.planes[lVar4][1] +
                     *(double *)(&screen_height + lVar4 * 8) *
                     *(double *)(&screen_height + lVar4 * 8) +
                     (double)transformed_box.planes[lVar4][0] *
                     (double)transformed_box.planes[lVar4][0]);
        dVar8 = -dVar1 / dVar8;
        local_2a8 = g_color[0] * (float)dVar8;
        depth = (IceTFloat)(g_color[1] * (float)dVar8);
        color[0] = (IceTFloat)(g_color[2] * (float)dVar8);
        color[1] = (IceTFloat)g_color[3];
        near_plane._4_4_ = (float)((double)far_distance * 0.5);
        if (g_transparent != '\0') {
          if (4.0 <= (dStack_288 - (double)far_distance) * 4.0) {
            local_304 = 0x1000;
          }
          else {
            local_304 = (int)((dStack_288 - (double)far_distance) * 4.0 * 1024.0);
          }
          dVar1 = (double)g_opacity_lookup[local_304];
          local_2a8 = (float)dVar1 * local_2a8;
          depth = (IceTFloat)((float)dVar1 * (float)depth);
          color[0] = (IceTFloat)((float)dVar1 * (float)color[0]);
          color[1] = (IceTFloat)((float)dVar1 * g_color[3]);
        }
      }
      if (g_transparent == '\0') {
        puVar3 = (undefined1 *)
                 ((long)depths + (long)((local_228 * colors_float._4_4_ + local_224) * 4));
        *puVar3 = (char)(int)(local_2a8 * 255.0);
        puVar3[1] = (char)(int)((float)depth * 255.0);
        puVar3[2] = (char)(int)((float)color[0] * 255.0);
        puVar3[3] = (char)(int)((float)color[1] * 255.0);
        _pixel_y[(long)(local_228 * colors_float._4_4_) + (long)local_224] =
             (IceTFloat)near_plane._4_4_;
      }
      else {
        pfVar2 = (float *)(colors_byte +
                          (long)((local_228 * colors_float._4_4_ + local_224) * 4) * 4);
        *pfVar2 = local_2a8;
        pfVar2[1] = (float)depth;
        pfVar2[2] = (float)color[0];
        pfVar2[3] = (float)color[1];
      }
    }
  }
  if (g_first_render != '\0') {
    if (g_sync_render != '\0') {
      icetCommBarrier();
    }
    g_first_render = '\0';
  }
  return;
}

Assistant:

static void draw(const IceTDouble *projection_matrix,
                 const IceTDouble *modelview_matrix,
                 const IceTFloat *background_color,
                 const IceTInt *readback_viewport,
                 IceTImage result)
{
    IceTDouble transform[16];
    IceTDouble inverse_transpose_transform[16];
    IceTBoolean success;
    int planeIdx;
    struct hexahedron transformed_box;
    IceTInt screen_width;
    IceTInt screen_height;
    IceTFloat *colors_float = NULL;
    IceTUByte *colors_byte = NULL;
    IceTFloat *depths = NULL;
    IceTInt pixel_x;
    IceTInt pixel_y;
    IceTDouble ray_origin[3];
    IceTDouble ray_direction[3];

    icetMatrixMultiply(transform, projection_matrix, modelview_matrix);

    success = icetMatrixInverseTranspose((const IceTDouble *)transform,
                                         inverse_transpose_transform);
    if (!success) {
        printf("ERROR: Inverse failed.\n");
    }

    for (planeIdx = 0; planeIdx < NUM_HEX_PLANES; planeIdx++) {
        const IceTDouble *original_plane = unit_box.planes[planeIdx];
        IceTDouble *transformed_plane = transformed_box.planes[planeIdx];

        icetMatrixVectorMultiply(transformed_plane,
                                 inverse_transpose_transform,
                                 original_plane);
    }

    icetGetIntegerv(ICET_PHYSICAL_RENDER_WIDTH, &screen_width);
    icetGetIntegerv(ICET_PHYSICAL_RENDER_HEIGHT, &screen_height);

    if (g_transparent) {
        colors_float = icetImageGetColorf(result);
    } else {
        colors_byte = icetImageGetColorub(result);
        depths = icetImageGetDepthf(result);
    }

    ray_direction[0] = ray_direction[1] = 0.0;
    ray_direction[2] = 1.0;
    ray_origin[2] = -1.0;
    for (pixel_y = readback_viewport[1];
         pixel_y < readback_viewport[1] + readback_viewport[3];
         pixel_y++) {
        ray_origin[1] = (2.0*pixel_y)/screen_height - 1.0;
        for (pixel_x = readback_viewport[0];
             pixel_x < readback_viewport[0] + readback_viewport[2];
             pixel_x++) {
            IceTDouble near_distance;
            IceTDouble far_distance;
            IceTInt near_plane_index;
            IceTBoolean intersection_happened;
            IceTFloat color[4];
            IceTFloat depth;

            ray_origin[0] = (2.0*pixel_x)/screen_width - 1.0;

            intersect_ray_hexahedron(ray_origin,
                                     ray_direction,
                                     transformed_box,
                                     &near_distance,
                                     &far_distance,
                                     &near_plane_index,
                                     &intersection_happened);

            if (intersection_happened) {
                const IceTDouble *near_plane;
                IceTDouble shading;

                near_plane = transformed_box.planes[near_plane_index];
                shading = -near_plane[2]/sqrt(icetDot3(near_plane, near_plane));

                color[0] = g_color[0] * (IceTFloat)shading;
                color[1] = g_color[1] * (IceTFloat)shading;
                color[2] = g_color[2] * (IceTFloat)shading;
                color[3] = g_color[3];
                depth = (IceTFloat)(0.5*near_distance);
                if (g_transparent) {
                    /* Modify color by an opacity determined by thickness. */
                    IceTDouble thickness = far_distance - near_distance;
                    IceTDouble opacity = QUICK_OPACITY(4.0*thickness);
                    color[0] *= (IceTFloat)opacity;
                    color[1] *= (IceTFloat)opacity;
                    color[2] *= (IceTFloat)opacity;
                    color[3] *= (IceTFloat)opacity;
                }
            } else {
                color[0] = background_color[0];
                color[1] = background_color[1];
                color[2] = background_color[2];
                color[3] = background_color[3];
                depth = 1.0f;
            }

            if (g_transparent) {
                IceTFloat *color_dest
                    = colors_float + 4*(pixel_y*screen_width + pixel_x);
                color_dest[0] = color[0];
                color_dest[1] = color[1];
                color_dest[2] = color[2];
                color_dest[3] = color[3];
            } else {
                IceTUByte *color_dest
                    = colors_byte + 4*(pixel_y*screen_width + pixel_x);
                IceTFloat *depth_dest
                    = depths + pixel_y*screen_width + pixel_x;
                color_dest[0] = (IceTUByte)(color[0]*255);
                color_dest[1] = (IceTUByte)(color[1]*255);
                color_dest[2] = (IceTUByte)(color[2]*255);
                color_dest[3] = (IceTUByte)(color[3]*255);
                depth_dest[0] = depth;
            }
        }
    }

    if (g_first_render) {
        if (g_sync_render) {
            /* The rendering we are using here is pretty crummy.  It is not
               meant to be practical but to create reasonable images to
               composite.  One problem with it is that the render times are not
               well balanced even though everyone renders roughly the same sized
               object.  If you want to time the composite performance, this can
               interfere with the measurements.  To get around this problem, do
               a barrier that makes it look as if all rendering finishes at the
               same time.  Note that there is a remote possibility that not
               every process will render something, in which case this will
               deadlock.  Note that we make sure only to sync once to get around
               the less remote possibility that some, but not all, processes
               render more than once. */
            icetCommBarrier();
        }
        g_first_render = ICET_FALSE;
    }
}